

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O2

void amrex::average_edge_to_cellcenter
               (MultiFab *cc,int dcomp,
               Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *edge,
               int ngrow)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  Box bx;
  Array4<double> local_190;
  Array4<const_double> local_150;
  Array4<const_double> local_110;
  Array4<const_double> local_d0;
  MFIter mfi;
  
  MFIter::MFIter(&mfi,(FabArrayBase *)cc,true);
  while (mfi.currentIndex < mfi.endIndex) {
    MFIter::growntilebox(&bx,&mfi,ngrow);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_190,&cc->super_FabArray<amrex::FArrayBox>,&mfi);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_d0,
               &(*(edge->
                  super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>).
                  super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                  ._M_impl.super__Vector_impl_data._M_start)->super_FabArray<amrex::FArrayBox>,&mfi)
    ;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_110,
               &(edge->
                super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>).
                super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                ._M_impl.super__Vector_impl_data._M_start[1]->super_FabArray<amrex::FArrayBox>,&mfi)
    ;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_150,
               &(edge->
                super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>).
                super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                ._M_impl.super__Vector_impl_data._M_start[2]->super_FabArray<amrex::FArrayBox>,&mfi)
    ;
    lVar9 = (long)bx.smallend.vect[0] * 8;
    lVar19 = (long)bx.smallend.vect[2];
    iVar8 = bx.smallend.vect[2];
    while (iVar8 = iVar8 + 1, (int)lVar19 <= bx.bigend.vect[2]) {
      lVar1 = lVar19 + 1;
      lVar11 = (long)local_190.begin.x;
      lVar16 = (lVar19 - local_190.begin.z) * local_190.kstride;
      lVar2 = (lVar19 - local_150.begin.z) * local_150.kstride * 8 + (long)local_150.begin.x * -8 +
              lVar9;
      lVar12 = lVar19 - local_110.begin.z;
      lVar6 = ((long)iVar8 - (long)local_d0.begin.z) * local_d0.kstride * 8 +
              (long)local_d0.begin.x * -8 + lVar9;
      lVar7 = (lVar19 - local_d0.begin.z) * local_d0.kstride * 8 + (long)local_d0.begin.x * -8 +
              lVar9;
      lVar15 = (long)bx.smallend.vect[1];
      while (lVar19 = lVar1, lVar15 <= bx.bigend.vect[1]) {
        if (bx.bigend.vect[0] < bx.smallend.vect[0]) {
          lVar15 = lVar15 + 1;
        }
        else {
          lVar19 = lVar15 + 1;
          lVar14 = (lVar15 - local_190.begin.y) * local_190.jstride * 8;
          lVar17 = (lVar15 - local_110.begin.y) * local_110.jstride * 8;
          lVar3 = (lVar15 - local_150.begin.y) * local_150.jstride * 8 + lVar2;
          lVar4 = (lVar19 - local_150.begin.y) * local_150.jstride * 8 + lVar2;
          lVar5 = lVar17 + ((long)iVar8 - (long)local_110.begin.z) * local_110.kstride * 8 +
                           (long)local_110.begin.x * -8 + lVar9 + 8;
          lVar17 = lVar17 + lVar12 * local_110.kstride * 8 + (long)local_110.begin.x * -8 + 8 +
                            lVar9;
          lVar10 = (lVar15 - local_d0.begin.y) * local_d0.jstride * 8;
          lVar13 = (lVar19 - local_d0.begin.y) * local_d0.jstride * 8;
          lVar18 = 0;
          do {
            *(double *)
             ((long)local_190.p +
             lVar18 * 8 +
             lVar14 + (long)dcomp * 8 * local_190.nstride + lVar16 * 8 + lVar11 * -8 + lVar9) =
                 (*(double *)((long)local_d0.p + lVar18 * 8 + lVar10 + lVar7) +
                  *(double *)((long)local_d0.p + lVar18 * 8 + lVar13 + lVar7) +
                  *(double *)((long)local_d0.p + lVar18 * 8 + lVar10 + lVar6) +
                 *(double *)((long)local_d0.p + lVar18 * 8 + lVar13 + lVar6)) * 0.25;
            *(double *)
             ((long)local_190.p +
             lVar18 * 8 +
             lVar14 + (long)(dcomp + 1) * 8 * local_190.nstride + lVar16 * 8 + lVar11 * -8 + lVar9)
                 = (*(double *)((long)local_110.p + lVar18 * 8 + lVar17 + -8) +
                    *(double *)((long)local_110.p + lVar18 * 8 + lVar17) +
                    *(double *)((long)local_110.p + lVar18 * 8 + lVar5 + -8) +
                   *(double *)((long)local_110.p + lVar18 * 8 + lVar5)) * 0.25;
            *(double *)
             ((long)local_190.p +
             lVar18 * 8 +
             lVar14 + local_190.nstride * (long)(dcomp + 2) * 8 + lVar16 * 8 + lVar11 * -8 + lVar9)
                 = (*(double *)((long)local_150.p + lVar18 * 8 + lVar3) +
                    *(double *)((long)local_150.p + lVar18 * 8 + lVar3 + 8) +
                    *(double *)((long)local_150.p + lVar18 * 8 + lVar4) +
                   *(double *)((long)local_150.p + lVar18 * 8 + lVar4 + 8)) * 0.25;
            lVar18 = lVar18 + 1;
            lVar15 = lVar19;
          } while ((bx.bigend.vect[0] - bx.smallend.vect[0]) + 1 != (int)lVar18);
        }
      }
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  return;
}

Assistant:

void average_edge_to_cellcenter (MultiFab& cc, int dcomp,
        const Vector<const MultiFab*>& edge, int ngrow)
    {
        AMREX_ASSERT(cc.nComp() >= dcomp + AMREX_SPACEDIM);
        AMREX_ASSERT(edge.size() == AMREX_SPACEDIM);
        AMREX_ASSERT(edge[0]->nComp() == 1);
#ifdef AMREX_USE_GPU
        if (Gpu::inLaunchRegion() && cc.isFusingCandidate()) {
            auto const& ccma = cc.arrays();
            AMREX_D_TERM(auto const& exma = edge[0]->const_arrays();,
                         auto const& eyma = edge[1]->const_arrays();,
                         auto const& ezma = edge[2]->const_arrays(););
            ParallelFor(cc, IntVect(ngrow),
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
            {
                amrex_avg_eg_to_cc(i, j, k, ccma[box_no],
                                   AMREX_D_DECL(exma[box_no], eyma[box_no], ezma[box_no]),
                                   dcomp);
            });
            Gpu::streamSynchronize();
        } else
#endif
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(cc,TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                const Box bx = mfi.growntilebox(ngrow);
                Array4<Real> const& ccarr = cc.array(mfi);
                AMREX_D_TERM(Array4<Real const> const& exarr = edge[0]->const_array(mfi);,
                             Array4<Real const> const& eyarr = edge[1]->const_array(mfi);,
                             Array4<Real const> const& ezarr = edge[2]->const_array(mfi););

                AMREX_HOST_DEVICE_PARALLEL_FOR_3D( bx, i, j, k,
                {
                    amrex_avg_eg_to_cc(i, j, k, ccarr, AMREX_D_DECL(exarr,eyarr,ezarr), dcomp);
                });
            }
        }
    }